

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

void llvm::APInt::tcFullMultiply
               (WordType *dst,WordType *lhs,WordType *rhs,uint lhsParts,uint rhsParts)

{
  uint local_2c;
  uint i;
  uint rhsParts_local;
  uint lhsParts_local;
  WordType *rhs_local;
  WordType *lhs_local;
  WordType *dst_local;
  
  if (rhsParts < lhsParts) {
    tcFullMultiply(dst,rhs,lhs,rhsParts,lhsParts);
  }
  else {
    if (dst == lhs || dst == rhs) {
      __assert_fail("dst != lhs && dst != rhs",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x9c2,
                    "static void llvm::APInt::tcFullMultiply(WordType *, const WordType *, const WordType *, unsigned int, unsigned int)"
                   );
    }
    tcSet(dst,0,rhsParts);
    for (local_2c = 0; local_2c < lhsParts; local_2c = local_2c + 1) {
      tcMultiplyPart(dst + local_2c,rhs,lhs[local_2c],0,rhsParts,rhsParts + 1,true);
    }
  }
  return;
}

Assistant:

void APInt::tcFullMultiply(WordType *dst, const WordType *lhs,
                           const WordType *rhs, unsigned lhsParts,
                           unsigned rhsParts) {
  /* Put the narrower number on the LHS for less loops below.  */
  if (lhsParts > rhsParts)
    return tcFullMultiply (dst, rhs, lhs, rhsParts, lhsParts);

  assert(dst != lhs && dst != rhs);

  tcSet(dst, 0, rhsParts);

  for (unsigned i = 0; i < lhsParts; i++)
    tcMultiplyPart(&dst[i], rhs, lhs[i], 0, rhsParts, rhsParts + 1, true);
}